

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O0

uintb __thiscall MemoryBank::getValue(MemoryBank *this,uintb offset,int4 size)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uintb uVar3;
  uint uVar4;
  ulong uVar5;
  ulong local_60;
  uintb val2;
  uintb val1;
  int4 gap;
  int4 size2;
  int4 size1;
  int4 skip;
  uintb ind;
  uintb alignmask;
  uintb res;
  int4 size_local;
  uintb offset_local;
  MemoryBank *this_local;
  
  uVar4 = this->wordsize - 1;
  uVar5 = offset & ((long)(int)uVar4 ^ 0xffffffffffffffffU);
  uVar4 = (uint)offset & uVar4;
  gap = this->wordsize - uVar4;
  if (gap < size) {
    val1._4_4_ = size - gap;
    iVar2 = (*this->_vptr_MemoryBank[1])(this,uVar5);
    val2 = CONCAT44(extraout_var,iVar2);
    iVar2 = (*this->_vptr_MemoryBank[1])(this,uVar5 + (long)this->wordsize);
    local_60 = CONCAT44(extraout_var_00,iVar2);
    val1._0_4_ = this->wordsize - val1._4_4_;
  }
  else {
    iVar2 = (*this->_vptr_MemoryBank[1])(this,uVar5);
    val2 = CONCAT44(extraout_var_01,iVar2);
    local_60 = 0;
    if (size == this->wordsize) {
      return val2;
    }
    val1._0_4_ = gap - size;
    val1._4_4_ = 0;
    gap = size;
  }
  bVar1 = AddrSpace::isBigEndian(this->space);
  if (bVar1) {
    if (val1._4_4_ == 0) {
      alignmask = val2 >> ((byte)((int)val1 << 3) & 0x3f);
    }
    else {
      alignmask = val2 << ((byte)(val1._4_4_ << 3) & 0x3f) |
                  local_60 >> ((byte)((int)val1 << 3) & 0x3f);
    }
  }
  else if (val1._4_4_ == 0) {
    alignmask = val2 >> ((byte)(uVar4 << 3) & 0x3f);
  }
  else {
    alignmask = val2 >> ((byte)(uVar4 << 3) & 0x3f) | local_60 << ((byte)(gap << 3) & 0x3f);
  }
  uVar3 = calc_mask(size);
  return uVar3 & alignmask;
}

Assistant:

uintb MemoryBank::getValue(uintb offset,int4 size) const

{
  uintb res;
 
  uintb alignmask = (uintb) (wordsize-1);
  uintb ind = offset & (~alignmask);
  int4 skip = offset & alignmask;
  int4 size1 = wordsize-skip;
  int4 size2;
  int4 gap;
  uintb val1,val2;
  if (size > size1) {		// We have spill over
    size2 = size - size1;
    val1 = find(ind);
    val2 = find(ind+wordsize);
    gap = wordsize - size2;
  }
  else {
    val1 = find(ind);
    val2 = 0;
    if (size == wordsize)
      return val1;
    gap = size1-size;
    size1 = size;
    size2 = 0;
  }

  if (space->isBigEndian()) {
    if (size2 == 0)
      res = val1>>(8*gap);
    else
      res = (val1<<(8*size2)) | (val2 >> (8*gap));
  }
  else {
    if (size2 == 0)
      res = val1 >> (skip*8);
    else
      res = (val1>>(skip*8)) | (val2<<(size1*8) );
  }
  res &= (uintb)calc_mask(size);
  return res;
}